

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  uint file;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  __sighandler_t p_Var6;
  uv_process_options_t *loop;
  passwd *ppVar7;
  uv_process_t *loop_00;
  uv_buf_t *buf;
  uv_fs_t *puVar8;
  anon_union_8_2_26168aa3_for_data aVar9;
  uv_stream_t *puVar10;
  uv_process_t *puVar11;
  code *req;
  uv_timer_t *puVar12;
  uv_process_options_t *loop_01;
  char *unaff_R15;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_a90 [8];
  uv_buf_t uStack_a88;
  uv_stdio_container_t uStack_a78;
  undefined4 uStack_a68;
  undefined4 uStack_a58;
  undefined1 auStack_a48 [704];
  uv_loop_t *puStack_788;
  uv_signal_cb p_Stack_780;
  uv_os_fd_t uStack_770;
  int iStack_76c;
  uv_buf_t uStack_768;
  char acStack_758 [16];
  uv_stdio_container_t uStack_748;
  uv_stream_t uStack_738;
  uv_fs_t uStack_630;
  uv_write_t uStack_478;
  uv_write_t uStack_3b8;
  uv_loop_t *puStack_2f8;
  uv_loop_t *puStack_2f0;
  code *pcStack_2e8;
  uv_loop_t *puStack_2e0;
  uv_loop_t *puStack_2d8;
  uv_loop_t *puStack_2d0;
  undefined1 auStack_2c4 [28];
  undefined1 auStack_290 [136];
  undefined1 local_208 [48];
  undefined1 local_1d8 [456];
  
  auStack_290._128_8_ = (void *)0x1788e1;
  init_process_options("spawn_helper3",exit_cb);
  auStack_290._128_8_ = (void *)0x1788e6;
  puVar4 = uv_default_loop();
  puVar5 = (uv_loop_t *)local_1d8;
  auStack_290._128_8_ = (void *)0x1788f8;
  uv_pipe_init(puVar4,(uv_pipe_t *)puVar5,0);
  options.stdio = (uv_stdio_container_t *)(local_208 + 0x10);
  loop_01 = &options;
  local_208._16_4_ = 0x11;
  options.stdio_count = 1;
  auStack_290._128_8_ = (void *)0x178926;
  local_208._24_8_ = puVar5;
  close(0);
  auStack_290._128_8_ = (void *)0x17892b;
  puVar4 = uv_default_loop();
  auStack_290._128_8_ = (void *)0x17893d;
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    auStack_290._128_8_ = (void *)0x178956;
    local_208._0_16_ = (undefined1  [16])uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    auStack_290._128_8_ = (void *)0x178981;
    iVar1 = uv_write((uv_write_t *)(local_1d8 + 0x108),(uv_stream_t *)local_1d8,
                     (uv_buf_t *)local_208,1,write_cb);
    if (iVar1 != 0) goto LAB_001789f5;
    auStack_290._128_8_ = (void *)0x17898a;
    puVar4 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x178994;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001789fa;
    if (exit_cb_called != 1) goto LAB_001789ff;
    if (close_cb_called != 2) goto LAB_00178a04;
    auStack_290._128_8_ = (void *)0x1789af;
    puVar5 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x1789c3;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    auStack_290._128_8_ = (void *)0x1789cd;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_290._128_8_ = (void *)0x1789d2;
    puVar4 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x1789da;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      auStack_290._128_8_ = (void *)0x1789e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_290._128_8_ = (void *)0x1789f5;
    run_test_spawn_closed_process_io_cold_1();
LAB_001789f5:
    auStack_290._128_8_ = (void *)0x1789fa;
    run_test_spawn_closed_process_io_cold_2();
LAB_001789fa:
    auStack_290._128_8_ = (void *)0x1789ff;
    run_test_spawn_closed_process_io_cold_3();
LAB_001789ff:
    auStack_290._128_8_ = (void *)0x178a04;
    run_test_spawn_closed_process_io_cold_4();
LAB_00178a04:
    auStack_290._128_8_ = (void *)0x178a09;
    run_test_spawn_closed_process_io_cold_5();
  }
  auStack_290._128_8_ = run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  loop = (uv_process_options_t *)auStack_290;
  auStack_290._128_8_ = puVar5;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset((sigset_t *)auStack_290);
  sigaddset((sigset_t *)auStack_290,0xf);
  iVar1 = pthread_sigmask(0,(__sigset_t *)auStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var6 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_00178b71;
    puVar5 = uv_default_loop();
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 != 0) goto LAB_00178b76;
    sigemptyset((sigset_t *)auStack_290);
    sigaddset((sigset_t *)auStack_290,0xf);
    iVar1 = pthread_sigmask(1,(__sigset_t *)auStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_00178b7b;
    p_Var6 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_00178b80;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_00178b85;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_00178b8a;
    puVar5 = uv_default_loop();
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178b8f;
    if (exit_cb_called != 1) goto LAB_00178b94;
    if (close_cb_called != 1) goto LAB_00178b99;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_00178b71:
    run_test_kill_cold_11();
LAB_00178b76:
    run_test_kill_cold_2();
LAB_00178b7b:
    run_test_kill_cold_3();
LAB_00178b80:
    run_test_kill_cold_10();
LAB_00178b85:
    run_test_kill_cold_4();
LAB_00178b8a:
    run_test_kill_cold_5();
LAB_00178b8f:
    run_test_kill_cold_6();
LAB_00178b94:
    run_test_kill_cold_7();
LAB_00178b99:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  puStack_2d0 = (uv_loop_t *)0x178bb3;
  auStack_2c4._20_8_ = loop;
  _Var2 = getuid();
  if (_Var2 != 0) {
    puStack_2d0 = (uv_loop_t *)0x178ceb;
    run_test_spawn_setuid_setgid_cold_1();
    return 1;
  }
  puStack_2d0 = (uv_loop_t *)0x178bce;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_2d0 = (uv_loop_t *)0x178bda;
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    puStack_2d0 = (uv_loop_t *)0x178d03;
    run_test_spawn_setuid_setgid_cold_8();
LAB_00178d03:
    puStack_2d0 = (uv_loop_t *)0x178d08;
    run_test_spawn_setuid_setgid_cold_7();
LAB_00178d08:
    puStack_2d0 = (uv_loop_t *)0x178d0d;
    run_test_spawn_setuid_setgid_cold_2();
LAB_00178d0d:
    puStack_2d0 = (uv_loop_t *)0x178d12;
    run_test_spawn_setuid_setgid_cold_3();
LAB_00178d12:
    puStack_2d0 = (uv_loop_t *)0x178d17;
    run_test_spawn_setuid_setgid_cold_4();
  }
  else {
    options.uid = ppVar7->pw_uid;
    loop = &options;
    options.gid = ppVar7->pw_gid;
    unaff_R15 = "%d";
    puStack_2d0 = (uv_loop_t *)0x178c22;
    snprintf(auStack_2c4 + 10,10,"%d",(ulong)ppVar7->pw_uid);
    loop_01 = (uv_process_options_t *)auStack_2c4;
    puStack_2d0 = (uv_loop_t *)0x178c3d;
    snprintf((char *)loop_01,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = auStack_2c4 + 10;
    options.args[3] = (char *)loop_01;
    options.flags = 3;
    puStack_2d0 = (uv_loop_t *)0x178c62;
    puVar5 = uv_default_loop();
    puStack_2d0 = (uv_loop_t *)0x178c74;
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) {
        puStack_2d0 = (uv_loop_t *)0x178cf7;
        run_test_spawn_setuid_setgid_cold_6();
        return 1;
      }
      goto LAB_00178d03;
    }
    puStack_2d0 = (uv_loop_t *)0x178c7d;
    puVar5 = uv_default_loop();
    puStack_2d0 = (uv_loop_t *)0x178c87;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178d08;
    if (exit_cb_called != 1) goto LAB_00178d0d;
    if (close_cb_called != 1) goto LAB_00178d12;
    puStack_2d0 = (uv_loop_t *)0x178ca2;
    loop_01 = (uv_process_options_t *)uv_default_loop();
    loop = (uv_process_options_t *)0x0;
    puStack_2d0 = (uv_loop_t *)0x178cb8;
    uv_walk((uv_loop_t *)loop_01,close_walk_cb,(void *)0x0);
    puStack_2d0 = (uv_loop_t *)0x178cc2;
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    puStack_2d0 = (uv_loop_t *)0x178cc7;
    puVar5 = uv_default_loop();
    puStack_2d0 = (uv_loop_t *)0x178ccf;
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      puStack_2d0 = (uv_loop_t *)0x178cd8;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_2d0 = (uv_loop_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_5();
  puStack_2d8 = (uv_loop_t *)0x178d22;
  puStack_2d0 = (uv_loop_t *)loop;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_2d8 = (uv_loop_t *)0x178d32;
    puVar5 = (uv_loop_t *)getpwnam("nobody");
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00178e12;
    puStack_2d8 = (uv_loop_t *)0x178d46;
    iVar1 = setgid(*(__gid_t *)((long)puVar5->handle_queue + 4));
    loop = (uv_process_options_t *)puVar5;
    if (iVar1 != 0) goto LAB_00178e17;
    puStack_2d8 = (uv_loop_t *)0x178d56;
    iVar1 = setuid(*(__uid_t *)puVar5->handle_queue);
    if (iVar1 == 0) goto LAB_00178d5e;
  }
  else {
LAB_00178d5e:
    puStack_2d8 = (uv_loop_t *)0x178d71;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_2d8 = (uv_loop_t *)0x178d8e;
    puVar5 = uv_default_loop();
    puStack_2d8 = (uv_loop_t *)0x178da0;
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 == -1) {
      puStack_2d8 = (uv_loop_t *)0x178daa;
      puVar5 = uv_default_loop();
      puStack_2d8 = (uv_loop_t *)0x178db4;
      iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00178e03;
      if (close_cb_called != 0) goto LAB_00178e08;
      puStack_2d8 = (uv_loop_t *)0x178dc6;
      loop = (uv_process_options_t *)uv_default_loop();
      puStack_2d8 = (uv_loop_t *)0x178dda;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_2d8 = (uv_loop_t *)0x178de4;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puStack_2d8 = (uv_loop_t *)0x178de9;
      puVar5 = uv_default_loop();
      puStack_2d8 = (uv_loop_t *)0x178df1;
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        puStack_2d8 = (uv_loop_t *)0x178dfa;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_2d8 = (uv_loop_t *)0x178e03;
      run_test_spawn_setuid_fails_cold_3();
LAB_00178e03:
      puStack_2d8 = (uv_loop_t *)0x178e08;
      run_test_spawn_setuid_fails_cold_4();
LAB_00178e08:
      puStack_2d8 = (uv_loop_t *)0x178e0d;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_2d8 = (uv_loop_t *)0x178e12;
    run_test_spawn_setuid_fails_cold_6();
LAB_00178e12:
    puStack_2d8 = (uv_loop_t *)0x178e17;
    run_test_spawn_setuid_fails_cold_7();
LAB_00178e17:
    puStack_2d8 = (uv_loop_t *)0x178e1c;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_2d8 = (uv_loop_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_2e0 = (uv_loop_t *)0x178e27;
  puStack_2d8 = (uv_loop_t *)loop;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_2e0 = (uv_loop_t *)0x178e37;
    puVar5 = (uv_loop_t *)getpwnam("nobody");
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00178f17;
    puStack_2e0 = (uv_loop_t *)0x178e4b;
    iVar1 = setgid(*(__gid_t *)((long)puVar5->handle_queue + 4));
    loop = (uv_process_options_t *)puVar5;
    if (iVar1 != 0) goto LAB_00178f1c;
    puStack_2e0 = (uv_loop_t *)0x178e5b;
    iVar1 = setuid(*(__uid_t *)puVar5->handle_queue);
    if (iVar1 == 0) goto LAB_00178e63;
  }
  else {
LAB_00178e63:
    puStack_2e0 = (uv_loop_t *)0x178e76;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_2e0 = (uv_loop_t *)0x178e93;
    puVar5 = uv_default_loop();
    puStack_2e0 = (uv_loop_t *)0x178ea5;
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 == -1) {
      puStack_2e0 = (uv_loop_t *)0x178eaf;
      puVar5 = uv_default_loop();
      puStack_2e0 = (uv_loop_t *)0x178eb9;
      iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00178f08;
      if (close_cb_called != 0) goto LAB_00178f0d;
      puStack_2e0 = (uv_loop_t *)0x178ecb;
      loop = (uv_process_options_t *)uv_default_loop();
      puStack_2e0 = (uv_loop_t *)0x178edf;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_2e0 = (uv_loop_t *)0x178ee9;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puStack_2e0 = (uv_loop_t *)0x178eee;
      puVar5 = uv_default_loop();
      puStack_2e0 = (uv_loop_t *)0x178ef6;
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        puStack_2e0 = (uv_loop_t *)0x178eff;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_2e0 = (uv_loop_t *)0x178f08;
      run_test_spawn_setgid_fails_cold_3();
LAB_00178f08:
      puStack_2e0 = (uv_loop_t *)0x178f0d;
      run_test_spawn_setgid_fails_cold_4();
LAB_00178f0d:
      puStack_2e0 = (uv_loop_t *)0x178f12;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_2e0 = (uv_loop_t *)0x178f17;
    run_test_spawn_setgid_fails_cold_6();
LAB_00178f17:
    puStack_2e0 = (uv_loop_t *)0x178f1c;
    run_test_spawn_setgid_fails_cold_7();
LAB_00178f1c:
    puStack_2e0 = (uv_loop_t *)0x178f21;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_2e0 = (uv_loop_t *)run_test_spawn_auto_unref;
  run_test_spawn_setgid_fails_cold_2();
  pcStack_2e8 = (code *)0x178f35;
  puStack_2e0 = (uv_loop_t *)loop;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  pcStack_2e8 = (code *)0x178f3a;
  puVar5 = uv_default_loop();
  pcStack_2e8 = (code *)0x178f50;
  iVar1 = uv_spawn(puVar5,&process,&options);
  if (iVar1 == 0) {
    pcStack_2e8 = (code *)0x178f5d;
    puVar5 = uv_default_loop();
    pcStack_2e8 = (code *)0x178f67;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178ff3;
    pcStack_2e8 = (code *)0x178f7b;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 0) goto LAB_00178ff8;
    pcStack_2e8 = (code *)0x178f8d;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    pcStack_2e8 = (code *)0x178f92;
    puVar5 = uv_default_loop();
    pcStack_2e8 = (code *)0x178f9c;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178ffd;
    pcStack_2e8 = (code *)0x178fac;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 1) goto LAB_00179002;
    pcStack_2e8 = (code *)0x178fb6;
    loop = (uv_process_options_t *)uv_default_loop();
    pcStack_2e8 = (code *)0x178fca;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    pcStack_2e8 = (code *)0x178fd4;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    pcStack_2e8 = (code *)0x178fd9;
    puVar5 = uv_default_loop();
    pcStack_2e8 = (code *)0x178fe1;
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      pcStack_2e8 = (code *)0x178fea;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2e8 = (code *)0x178ff3;
    run_test_spawn_auto_unref_cold_1();
LAB_00178ff3:
    pcStack_2e8 = (code *)0x178ff8;
    run_test_spawn_auto_unref_cold_2();
LAB_00178ff8:
    pcStack_2e8 = (code *)0x178ffd;
    run_test_spawn_auto_unref_cold_3();
LAB_00178ffd:
    pcStack_2e8 = (code *)0x179002;
    run_test_spawn_auto_unref_cold_4();
LAB_00179002:
    pcStack_2e8 = (code *)0x179007;
    run_test_spawn_auto_unref_cold_5();
  }
  pcStack_2e8 = run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  acStack_758._0_8_ = 0x6c756e2f7665642f;
  acStack_758[8] = 'l';
  acStack_758[9] = '\0';
  puVar8 = &uStack_630;
  p_Stack_780 = (uv_signal_cb)0x17904a;
  puStack_2f8 = (uv_loop_t *)loop;
  puStack_2f0 = (uv_loop_t *)loop_01;
  pcStack_2e8 = (code *)unaff_R15;
  file = uv_fs_open((uv_loop_t *)0x0,puVar8,acStack_758,2,0,(uv_fs_cb)0x0);
  iVar1 = (int)puVar8;
  if (file == 0xffffffff) {
    p_Stack_780 = (uv_signal_cb)0x17920c;
    run_test_spawn_fs_open_cold_10();
LAB_0017920c:
    p_Stack_780 = (uv_signal_cb)0x179211;
    run_test_spawn_fs_open_cold_1();
LAB_00179211:
    p_Stack_780 = (uv_signal_cb)0x179216;
    run_test_spawn_fs_open_cold_2();
LAB_00179216:
    p_Stack_780 = (uv_signal_cb)0x17921b;
    run_test_spawn_fs_open_cold_3();
LAB_0017921b:
    p_Stack_780 = (uv_signal_cb)0x179220;
    run_test_spawn_fs_open_cold_4();
LAB_00179220:
    p_Stack_780 = (uv_signal_cb)0x179225;
    run_test_spawn_fs_open_cold_5();
LAB_00179225:
    p_Stack_780 = (uv_signal_cb)0x17922a;
    run_test_spawn_fs_open_cold_6();
LAB_0017922a:
    p_Stack_780 = (uv_signal_cb)0x17922f;
    run_test_spawn_fs_open_cold_7();
LAB_0017922f:
    p_Stack_780 = (uv_signal_cb)0x179234;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    loop = (uv_process_options_t *)(ulong)file;
    p_Stack_780 = (uv_signal_cb)0x179066;
    uStack_770 = uv_get_osfhandle((int)uStack_630.result);
    p_Stack_780 = (uv_signal_cb)0x179072;
    uv_fs_req_cleanup(&uStack_630);
    p_Stack_780 = (uv_signal_cb)0x179085;
    init_process_options("spawn_helper8",exit_cb);
    p_Stack_780 = (uv_signal_cb)0x17908a;
    puVar5 = uv_default_loop();
    p_Stack_780 = (uv_signal_cb)0x17909c;
    aVar9.stream = &uStack_738;
    iVar3 = uv_pipe_init(puVar5,&uStack_738,0);
    iVar1 = aVar9.fd;
    if (iVar3 != 0) goto LAB_0017920c;
    options.stdio = &uStack_748;
    uStack_748.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    p_Stack_780 = (uv_signal_cb)0x1790d4;
    uStack_748.data.stream = &uStack_738;
    iStack_76c = dup(uStack_770);
    p_Stack_780 = (uv_signal_cb)0x1790dd;
    puVar5 = uv_default_loop();
    iVar1 = 0x34b410;
    p_Stack_780 = (uv_signal_cb)0x1790ef;
    iVar3 = uv_spawn(puVar5,&process,&options);
    if (iVar3 != 0) goto LAB_00179211;
    p_Stack_780 = (uv_signal_cb)0x179106;
    uStack_768 = uv_buf_init((char *)&uStack_770,4);
    puVar10 = &uStack_738;
    p_Stack_780 = (uv_signal_cb)0x179133;
    iVar3 = uv_write(&uStack_3b8,puVar10,&uStack_768,1,write_null_cb);
    iVar1 = (int)puVar10;
    if (iVar3 != 0) goto LAB_00179216;
    p_Stack_780 = (uv_signal_cb)0x17914a;
    uStack_768 = uv_buf_init((char *)&iStack_76c,4);
    puVar10 = &uStack_738;
    p_Stack_780 = (uv_signal_cb)0x179177;
    iVar3 = uv_write(&uStack_478,puVar10,&uStack_768,1,write_cb);
    iVar1 = (int)puVar10;
    if (iVar3 != 0) goto LAB_0017921b;
    p_Stack_780 = (uv_signal_cb)0x179184;
    puVar5 = uv_default_loop();
    iVar1 = 0;
    p_Stack_780 = (uv_signal_cb)0x17918e;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00179220;
    puVar8 = &uStack_630;
    p_Stack_780 = (uv_signal_cb)0x1791a9;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,puVar8,file,(uv_fs_cb)0x0);
    iVar1 = (int)puVar8;
    if (iVar3 != 0) goto LAB_00179225;
    if (exit_cb_called != 1) goto LAB_0017922a;
    if (close_cb_called != 2) goto LAB_0017922f;
    p_Stack_780 = (uv_signal_cb)0x1791c4;
    loop = (uv_process_options_t *)uv_default_loop();
    p_Stack_780 = (uv_signal_cb)0x1791d8;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    p_Stack_780 = (uv_signal_cb)0x1791e2;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    p_Stack_780 = (uv_signal_cb)0x1791e7;
    puVar5 = uv_default_loop();
    p_Stack_780 = (uv_signal_cb)0x1791ef;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      p_Stack_780 = (uv_signal_cb)0x1791f8;
      uv_library_shutdown();
      return 0;
    }
  }
  p_Stack_780 = write_null_cb;
  run_test_spawn_fs_open_cold_9();
  if (iVar1 == 0) {
    return extraout_EAX;
  }
  puStack_788 = (uv_loop_t *)run_test_closed_fd_events;
  write_null_cb_cold_1();
  puStack_788 = (uv_loop_t *)loop;
  uStack_a88 = uv_buf_init("",1);
  loop_00 = (uv_process_t *)auStack_a90;
  req = (code *)0x0;
  iVar1 = uv_pipe((uv_os_fd_t *)loop_00,0,0);
  if (iVar1 == 0) {
    if ((int)auStack_a90._0_4_ < 3) goto LAB_00179528;
    if ((int)auStack_a90._4_4_ < 3) goto LAB_0017952d;
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_a78;
    uStack_a78.flags = UV_INHERIT_FD;
    uStack_a78.data.fd = auStack_a90._0_4_;
    uStack_a68 = 0;
    uStack_a58 = 0;
    loop_00 = (uv_process_t *)uv_default_loop();
    puVar11 = &process;
    iVar1 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
    req = (code *)puVar11;
    if (iVar1 != 0) goto LAB_00179532;
    uv_unref((uv_handle_t *)&process);
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)auStack_a48;
    iVar1 = uv_pipe_init((uv_loop_t *)loop_00,(uv_pipe_t *)req,0);
    if (iVar1 != 0) goto LAB_00179537;
    req = (code *)(ulong)(uint)auStack_a90._0_4_;
    loop_00 = (uv_process_t *)auStack_a48;
    iVar1 = uv_pipe_open((uv_pipe_t *)loop_00,auStack_a90._0_4_);
    if (iVar1 != 0) goto LAB_0017953c;
    auStack_a90._0_4_ = 0xffffffff;
    req = on_alloc;
    loop_00 = (uv_process_t *)auStack_a48;
    iVar1 = uv_read_start((uv_stream_t *)loop_00,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_00179541;
    req = (code *)(auStack_a48 + 0x108);
    loop_00 = (uv_process_t *)0x0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)req,auStack_a90._4_4_,&uStack_a88,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 1) goto LAB_00179546;
    if ((uv_loop_s *)auStack_a48._352_8_ != (uv_loop_s *)0x1) goto LAB_0017954b;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_a48 + 0x108));
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_00179550;
    if (output_used != 1) goto LAB_00179555;
    uv_close((uv_handle_t *)auStack_a48,close_cb);
    req = (code *)(auStack_a48 + 0x108);
    loop_00 = (uv_process_t *)0x0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)req,auStack_a90._4_4_,&uStack_a88,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 1) goto LAB_0017955a;
    if ((uv_loop_s *)auStack_a48._352_8_ != (uv_loop_s *)0x1) goto LAB_0017955f;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_a48 + 0x108));
    loop_00 = (uv_process_t *)uv_default_loop();
    puVar12 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    req = (code *)puVar12;
    if (iVar1 != 0) goto LAB_00179564;
    puVar12 = &timer;
    req = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    loop_00 = (uv_process_t *)puVar12;
    if (iVar1 != 0) goto LAB_00179569;
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
    if (iVar1 == 1) {
      loop_00 = (uv_process_t *)uv_default_loop();
      req = (code *)0x1;
      iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
      if (iVar1 != 0) goto LAB_00179582;
    }
    if (timer_counter != 1) goto LAB_0017956e;
    loop_00 = &process;
    req = (code *)0xf;
    iVar1 = uv_process_kill(&process,0xf);
    if (iVar1 != 0) goto LAB_00179573;
    loop_00 = (uv_process_t *)(ulong)(uint)auStack_a90._4_4_;
    iVar1 = close(auStack_a90._4_4_);
    if (iVar1 != 0) goto LAB_00179578;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    loop_00 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_00179528:
    run_test_closed_fd_events_cold_2();
LAB_0017952d:
    run_test_closed_fd_events_cold_3();
LAB_00179532:
    run_test_closed_fd_events_cold_4();
LAB_00179537:
    run_test_closed_fd_events_cold_5();
LAB_0017953c:
    run_test_closed_fd_events_cold_6();
LAB_00179541:
    run_test_closed_fd_events_cold_7();
LAB_00179546:
    run_test_closed_fd_events_cold_8();
LAB_0017954b:
    run_test_closed_fd_events_cold_9();
LAB_00179550:
    run_test_closed_fd_events_cold_10();
LAB_00179555:
    run_test_closed_fd_events_cold_11();
LAB_0017955a:
    run_test_closed_fd_events_cold_12();
LAB_0017955f:
    run_test_closed_fd_events_cold_13();
LAB_00179564:
    run_test_closed_fd_events_cold_14();
LAB_00179569:
    run_test_closed_fd_events_cold_15();
LAB_0017956e:
    run_test_closed_fd_events_cold_17();
LAB_00179573:
    run_test_closed_fd_events_cold_18();
LAB_00179578:
    run_test_closed_fd_events_cold_19();
  }
  run_test_closed_fd_events_cold_20();
LAB_00179582:
  run_test_closed_fd_events_cold_16();
  uv_read_stop((uv_stream_t *)loop_00);
  on_read((uv_stream_t *)loop_00,(ssize_t)req,buf);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}